

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbrNtbdd.c
# Opt level: O2

void Aig_ManFreeGlobalBdds(Aig_Man_t *p,DdManager *dd)

{
  void *pvVar1;
  int i;
  int i_00;
  
  for (i_00 = 0; i_00 < p->vObjs->nSize; i_00 = i_00 + 1) {
    pvVar1 = Vec_PtrEntry(p->vObjs,i_00);
    if ((pvVar1 != (void *)0x0) && (*(DdNode **)((long)pvVar1 + 0x28) != (DdNode *)0x0)) {
      Cudd_RecursiveDeref(dd,*(DdNode **)((long)pvVar1 + 0x28));
      *(undefined8 *)((long)pvVar1 + 0x28) = 0;
    }
  }
  return;
}

Assistant:

void Aig_ManFreeGlobalBdds( Aig_Man_t * p, DdManager * dd ) 
{ 
    Aig_Obj_t * pObj;
    int i;
    Aig_ManForEachObj( p, pObj, i )
        if ( Aig_ObjGlobalBdd(pObj) )
            Aig_ObjCleanGlobalBdd( dd, pObj );
}